

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall QListView::QListView(QListView *this,QWidget *parent)

{
  QListViewPrivate *this_00;
  
  this_00 = (QListViewPrivate *)operator_new(0x5c0);
  QListViewPrivate::QListViewPrivate(this_00);
  QAbstractItemView::QAbstractItemView
            ((QAbstractItemView *)this,(QAbstractItemViewPrivate *)this_00,parent);
  *(undefined ***)
   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
       &PTR_metaObject_0081b970;
  *(undefined ***)
   &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
    super_QPaintDevice = &PTR__QListView_0081bc80;
  setViewMode(this,ListMode);
  QAbstractItemView::setSelectionMode((QAbstractItemView *)this,SingleSelection);
  QWidget::setAttribute((QWidget *)this,WA_MacShowFocusRect,true);
  QFramePrivate::updateStyledFrameWidths
            (*(QFramePrivate **)
              &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
               field_0x8);
  return;
}

Assistant:

QListView::QListView(QWidget *parent)
    : QAbstractItemView(*new QListViewPrivate, parent)
{
    setViewMode(ListMode);
    setSelectionMode(SingleSelection);
    setAttribute(Qt::WA_MacShowFocusRect);
    Q_D(QListView);               // We rely on a qobject_cast for PM_DefaultFrameWidth to change
    d->updateStyledFrameWidths(); // hence we have to force an update now that the object has been constructed
}